

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::ParseSegment<segment_command,section>(LoadCommand cmd,RangeSink *sink)

{
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view separator;
  string_view file_range;
  string_view file_range_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view file_range_01;
  string_view file_range_02;
  DataSource DVar1;
  uint uVar2;
  char *pcVar3;
  ulong vmsize;
  ulong vmaddr;
  RangeSink *in_RDI;
  string_view sVar4;
  string_view sVar5;
  string_view sVar6;
  string label;
  uint64_t filesize;
  section *section;
  uint32_t j;
  uint32_t nsects;
  bool unmapped;
  string_view segname;
  segment_command *segment;
  size_t in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  RangeSink *in_stack_fffffffffffffe18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe20;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *in_stack_fffffffffffffe28;
  string_view *in_stack_fffffffffffffe30;
  char *pcVar7;
  size_t in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe48;
  RangeSink *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  char *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  RangeSink *this;
  size_t in_stack_fffffffffffffe88;
  size_t sVar8;
  char *in_stack_fffffffffffffe90;
  Arena *pAVar9;
  size_t in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  string local_c0 [32];
  ulong local_a0;
  section *local_98;
  uint local_90;
  uint local_8c;
  undefined8 local_88;
  Arena *local_80;
  string_view local_78;
  size_t local_68;
  char *local_60;
  undefined8 local_58;
  Arena *local_50;
  string_view local_48;
  size_t local_38;
  char *local_30;
  byte local_21;
  string_view local_20;
  segment_command *local_10;
  RangeSink *local_8;
  
  this = (RangeSink *)&stack0x00000008;
  local_8 = in_RDI;
  local_10 = GetStructPointerAndAdvance<segment_command>(in_stack_fffffffffffffe30);
  local_20 = ArrayToStr(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  local_21 = local_10->maxprot == 0;
  DVar1 = RangeSink::data_source(local_8);
  if (DVar1 == kSegments) {
    if ((local_21 & 1) == 0) {
      local_68 = local_20._M_len;
      local_60 = local_20._M_str;
      vmsize = (ulong)local_10->vmaddr;
      vmaddr = (ulong)local_10->vmsize;
      local_88._0_4_ = (this->options_)._has_bits_;
      local_88._4_4_ = (this->options_)._cached_size_;
      local_80 = (this->options_).filename_.super_RepeatedPtrFieldBase.arena_;
      data_00._M_str = (char *)in_stack_fffffffffffffe30;
      data_00._M_len = (size_t)in_stack_fffffffffffffe28;
      local_78 = StrictSubstr(data_00,(size_t)in_stack_fffffffffffffe20,
                              (size_t)in_stack_fffffffffffffe18);
      name_01._M_str = in_stack_fffffffffffffe90;
      name_01._M_len = in_stack_fffffffffffffe88;
      file_range_01._M_str = in_stack_fffffffffffffea8;
      file_range_01._M_len = in_stack_fffffffffffffea0;
      RangeSink::AddRange(this,in_stack_fffffffffffffe78,name_01,vmaddr,vmsize,file_range_01);
    }
    else {
      local_38 = local_20._M_len;
      local_30 = local_20._M_str;
      local_58._0_4_ = (this->options_)._has_bits_;
      local_58._4_4_ = (this->options_)._cached_size_;
      local_50 = (this->options_).filename_.super_RepeatedPtrFieldBase.arena_;
      data._M_str = (char *)in_stack_fffffffffffffe30;
      data._M_len = (size_t)in_stack_fffffffffffffe28;
      local_48 = StrictSubstr(data,(size_t)in_stack_fffffffffffffe20,
                              (size_t)in_stack_fffffffffffffe18);
      name._M_str = in_stack_fffffffffffffe70;
      name._M_len = in_stack_fffffffffffffe68;
      file_range._M_len._4_4_ = in_stack_fffffffffffffe5c;
      file_range._M_len._0_4_ = in_stack_fffffffffffffe58;
      file_range._M_str = in_stack_fffffffffffffe60;
      RangeSink::AddFileRange(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,name,file_range);
    }
  }
  else {
    DVar1 = RangeSink::data_source(local_8);
    sVar6._M_str = (char *)in_stack_fffffffffffffe30;
    sVar6._M_len = in_stack_fffffffffffffe38;
    sVar5._M_str = in_stack_fffffffffffffe10;
    sVar5._M_len = in_stack_fffffffffffffe08;
    if (DVar1 != kSections) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/macho.cc"
                    ,0x11f,
                    "void bloaty::macho::ParseSegment(LoadCommand, RangeSink *) [Segment = segment_command, Section = section]"
                   );
    }
    local_8c = local_10->nsects;
    for (local_90 = 0; local_90 < local_8c; local_90 = local_90 + 1) {
      local_98 = GetStructPointerAndAdvance<section>((string_view *)sVar6._M_str);
      local_a0 = (ulong)local_98->size;
      uVar2 = (uint)(byte)local_98->flags;
      if (((uVar2 == 1) || (uVar2 == 0xc)) || (uVar2 == 0x12)) {
        local_a0 = 0;
      }
      ArrayToStr(sVar5._M_str,sVar5._M_len);
      std::
      make_tuple<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>>
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe18,
                 (basic_string_view<char,_std::char_traits<char>_> *)sVar5._M_str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18);
      separator._M_str = (char *)sVar6._M_len;
      separator._M_len = (size_t)sVar6._M_str;
      absl::
      StrJoin<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_fffffffffffffe28,separator);
      pcVar7 = sVar6._M_str;
      if ((local_21 & 1) == 0) {
        in_stack_fffffffffffffe18 = local_8;
        pcVar3 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view(local_c0);
        in_stack_fffffffffffffe20 =
             (basic_string_view<char,_std::char_traits<char>_> *)(ulong)local_98->addr;
        in_stack_fffffffffffffe28 =
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)(ulong)local_98->size;
        sVar8._0_4_ = (this->options_)._has_bits_;
        sVar8._4_4_ = (this->options_)._cached_size_;
        pAVar9 = (this->options_).filename_.super_RepeatedPtrFieldBase.arena_;
        sVar4._M_str = pcVar7;
        sVar4._M_len = (size_t)in_stack_fffffffffffffe28;
        sVar5 = StrictSubstr(sVar4,(size_t)in_stack_fffffffffffffe20,
                             (size_t)in_stack_fffffffffffffe18);
        name_02._M_str = (char *)pAVar9;
        name_02._M_len = sVar8;
        file_range_02._M_str = pcVar3;
        file_range_02._M_len = (size_t)sVar5._M_str;
        sVar6 = sVar5;
        RangeSink::AddRange(this,in_stack_fffffffffffffe78,name_02,
                            (uint64_t)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                            file_range_02);
      }
      else {
        std::__cxx11::string::operator_cast_to_basic_string_view(local_c0);
        data_01._M_str = sVar6._M_str;
        data_01._M_len = (size_t)in_stack_fffffffffffffe28;
        sVar4 = StrictSubstr(data_01,(size_t)in_stack_fffffffffffffe20,
                             (size_t)in_stack_fffffffffffffe18);
        name_00._M_str = in_stack_fffffffffffffe70;
        name_00._M_len = in_stack_fffffffffffffe68;
        file_range_00._M_len._4_4_ = uVar2;
        file_range_00._M_len._0_4_ = in_stack_fffffffffffffe58;
        file_range_00._M_str = in_stack_fffffffffffffe60;
        RangeSink::AddFileRange((RangeSink *)sVar4._M_len,sVar4._M_str,name_00,file_range_00);
      }
      std::__cxx11::string::~string(local_c0);
    }
  }
  return;
}

Assistant:

void ParseSegment(LoadCommand cmd, RangeSink* sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&cmd.command_data);
  string_view segname = ArrayToStr(segment->segname, 16);

  // For unknown reasons, some load commands will have maxprot = NONE
  // indicating they are not accessible, but will also contain a vmaddr
  // and vmsize.  In practice the vmaddr/vmsize of a section sometimes
  // fall within the segment, but sometimes exceed it, leading to an
  // error about exceeding the base map.
  //
  // Since such segments should not be mapped, we simply ignore the
  // vmaddr/vmsize of such segments.
  bool unmapped = segment->maxprot == VM_PROT_NONE;

  if (sink->data_source() == DataSource::kSegments) {
    if (unmapped) {
      sink->AddFileRange(
          "macho_segment", segname,
          StrictSubstr(cmd.file_data, segment->fileoff, segment->filesize));
    } else {
      sink->AddRange(
          "macho_segment", segname, segment->vmaddr, segment->vmsize,
          StrictSubstr(cmd.file_data, segment->fileoff, segment->filesize));
    }
  } else if (sink->data_source() == DataSource::kSections) {
    uint32_t nsects = segment->nsects;
    for (uint32_t j = 0; j < nsects; j++) {
      auto section = GetStructPointerAndAdvance<Section>(&cmd.command_data);

      // filesize equals vmsize unless the section is zerofill
      uint64_t filesize = section->size;
      switch (section->flags & SECTION_TYPE) {
        case S_ZEROFILL:
        case S_GB_ZEROFILL:
        case S_THREAD_LOCAL_ZEROFILL:
          filesize = 0;
          break;
        default:
          break;
      }

      std::string label = absl::StrJoin(
          std::make_tuple(segname, ArrayToStr(section->sectname, 16)), ",");
      if (unmapped) {
        sink->AddFileRange(
            "macho_section", label,
            StrictSubstr(cmd.file_data, section->offset, filesize));
      } else {
        sink->AddRange("macho_section", label, section->addr, section->size,
                       StrictSubstr(cmd.file_data, section->offset, filesize));
      }
    }
  } else {
    BLOATY_UNREACHABLE();
  }
}